

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadapi_pthreads.c
# Opt level: O3

void ThreadAPI_Sleep(uint milliseconds)

{
  timespec timeToSleep;
  timespec local_10;
  
  local_10.tv_sec = (ulong)milliseconds / 1000;
  local_10.tv_nsec = (long)((milliseconds % 1000) * 1000000);
  nanosleep(&local_10,(timespec *)0x0);
  return;
}

Assistant:

void ThreadAPI_Sleep(unsigned int milliseconds)
{
#ifdef TI_RTOS
    Task_sleep(milliseconds);
#else
    time_t seconds = milliseconds / 1000;
    long nsRemainder = (milliseconds % 1000) * 1000000;
    struct timespec timeToSleep = { seconds, nsRemainder };
    (void)nanosleep(&timeToSleep, NULL);
#endif
}